

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

bool __thiscall
OpenMD::FragmentStamp::isAtomInRigidBody
          (FragmentStamp *this,int atomIndex,int *whichRigidBody,int *consAtomIndex)

{
  int iVar1;
  RigidBodyStamp *pRVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  *whichRigidBody = -1;
  *consAtomIndex = -1;
  iVar1 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[atomIndex];
  if (-1 < (long)iVar1) {
    *whichRigidBody = iVar1;
    pRVar2 = (this->rigidBodyStamps_).
             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar1];
    lVar3 = *(long *)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    uVar4 = (long)*(pointer *)
                   ((long)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   + 8) - lVar3 >> 2;
    if (0 < (int)(uint)uVar4) {
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar4);
        }
        if (*(int *)(lVar3 + uVar5 * 4) == atomIndex) {
          *consAtomIndex = (int)uVar5;
          return true;
        }
        uVar5 = uVar5 + 1;
      } while (((uint)uVar4 & 0x7fffffff) != uVar5);
    }
  }
  return false;
}

Assistant:

bool FragmentStamp::isAtomInRigidBody(int atomIndex, int& whichRigidBody,
                                        int& consAtomIndex) {
    whichRigidBody = -1;
    consAtomIndex  = -1;

    if (atom2Rigidbody[atomIndex] >= 0) {
      whichRigidBody          = atom2Rigidbody[atomIndex];
      RigidBodyStamp* rbStamp = getRigidBodyStamp(whichRigidBody);
      int numAtom             = rbStamp->getNMembers();
      for (int j = 0; j < numAtom; j++) {
        if (rbStamp->getMemberAt(j) == atomIndex) {
          consAtomIndex = j;
          return true;
        }
      }
    }

    return false;
  }